

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O0

void __thiscall CanonicalizePathUpDir::~CanonicalizePathUpDir(CanonicalizePathUpDir *this)

{
  CanonicalizePathUpDir *this_local;
  
  ~CanonicalizePathUpDir(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CanonicalizePath, UpDir) {
  string path, err;
  path = "../../foo/bar.h";
  EXPECT_TRUE(CanonicalizePath(&path, &err));
  EXPECT_EQ("../../foo/bar.h", path);

  path = "test/../../foo/bar.h";
  EXPECT_TRUE(CanonicalizePath(&path, &err));
  EXPECT_EQ("../foo/bar.h", path);
}